

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O0

int lsrkStep_ReInit_Commons(void *arkode_mem,ARKRhsFn rhs,sunrealtype t0,N_Vector y0)

{
  N_Vector in_RDX;
  ARKodeMem in_RSI;
  sunrealtype in_XMM0_Qa;
  int retval;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 *in_stack_ffffffffffffffc8;
  undefined4 local_30;
  int in_stack_ffffffffffffffd4;
  uint local_4;
  
  local_4 = lsrkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(ARKodeLSRKStepMem *)0x16a2e4);
  if (local_4 == 0) {
    if (*(int *)(CONCAT44(in_stack_ffffffffffffffd4,local_30) + 0x3c0) == 0) {
      arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffd4,local_30),-0x17,0xf3,
                      "lsrkStep_ReInit_Commons",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,"Attempt to call before ARKodeInit.");
      local_4 = 0xffffffe9;
    }
    else if (in_RSI == (ARKodeMem)0x0) {
      arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffd4,local_30),-0x16,0xfb,
                      "lsrkStep_ReInit_Commons",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,"Must specify at least one of fe, fi (both NULL).");
      local_4 = 0xffffffea;
    }
    else if (in_RDX == (N_Vector)0x0) {
      arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffd4,local_30),-0x16,0x103,
                      "lsrkStep_ReInit_Commons",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,"y0 = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else {
      *in_stack_ffffffffffffffc8 = in_RSI;
      local_4 = arkInit(in_RSI,in_XMM0_Qa,in_RDX,in_stack_ffffffffffffffd4);
      if (local_4 == 0) {
        in_stack_ffffffffffffffc8[4] = 0;
        in_stack_ffffffffffffffc8[5] = 0;
        *(undefined4 *)(in_stack_ffffffffffffffc8 + 6) = 0;
        in_stack_ffffffffffffffc8[0xc] = 0;
        in_stack_ffffffffffffffc8[0xd] = 0;
        in_stack_ffffffffffffffc8[7] = 0;
        *(undefined4 *)(in_stack_ffffffffffffffc8 + 0x10) = 1;
        *(undefined4 *)(in_stack_ffffffffffffffc8 + 0x11) = 0;
        local_4 = 0;
      }
      else {
        arkProcessError((ARKodeMem)CONCAT44(in_stack_ffffffffffffffd4,local_30),(int)(ulong)local_4,
                        0x10f,"lsrkStep_ReInit_Commons",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                        ,"Unable to initialize main ARKODE infrastructure");
      }
    }
  }
  return local_4;
}

Assistant:

int lsrkStep_ReInit_Commons(void* arkode_mem, ARKRhsFn rhs, sunrealtype t0,
                            N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return ARK_NO_MALLOC;
  }

  /* Check that rhs is supplied */
  if (rhs == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return ARK_ILL_INPUT;
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return ARK_ILL_INPUT;
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fe = rhs;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    return retval;
  }

  /* Initialize all the counters, flags and stats */
  step_mem->nfe                 = 0;
  step_mem->dom_eig_num_evals   = 0;
  step_mem->stage_max           = 0;
  step_mem->spectral_radius_max = 0;
  step_mem->spectral_radius_min = 0;
  step_mem->dom_eig_nst         = 0;
  step_mem->dom_eig_update      = SUNTRUE;
  step_mem->dom_eig_is_current  = SUNFALSE;

  return ARK_SUCCESS;
}